

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpscheduler.cpp
# Opt level: O2

RTPTime __thiscall jrtplib::RTCPScheduler::GetTransmissionDelay(RTCPScheduler *this)

{
  double dVar1;
  RTPTime RVar2;
  
  if (this->firstcall == true) {
    this->firstcall = false;
    RVar2 = RTPTime::CurrentTime();
    (this->prevrtcptime).m_t = RVar2.m_t;
    this->pmembers = this->sources->activecount;
    CalculateNextRTCPTime(this);
  }
  RVar2 = RTPTime::CurrentTime();
  dVar1 = (this->nextrtcptime).m_t;
  return (RTPTime)(double)(~-(ulong)(dVar1 < RVar2.m_t) & (ulong)(dVar1 - RVar2.m_t));
}

Assistant:

RTPTime RTCPScheduler::GetTransmissionDelay()
{
	if (firstcall)
	{
		firstcall = false;
		prevrtcptime = RTPTime::CurrentTime();
		pmembers = sources.GetActiveMemberCount();
		CalculateNextRTCPTime();
	}
	
	RTPTime curtime = RTPTime::CurrentTime();

	if (curtime > nextrtcptime) // packet should be sent
		return RTPTime(0,0);

	RTPTime diff = nextrtcptime;
	diff -= curtime;
	
	return diff;
}